

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::ResolveLanguageCompiler
          (cmGlobalGenerator *this,string *lang,cmMakefile *mf,bool optional)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  cmState *pcVar3;
  bool bVar4;
  int iVar5;
  cmValue cVar6;
  string *in_name;
  cmValue cVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string changeVars;
  string cnameString;
  string pathString;
  cmList cnameArgList;
  string langComp;
  string path;
  string local_138;
  undefined1 local_118 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  container_type local_b8;
  string local_98;
  string local_78;
  pointer local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  local_78._M_dataplus._M_p = (pointer)0x6;
  local_78._M_string_length = 0x7ecd63;
  local_78.field_2._M_allocated_capacity = 0;
  local_58 = (lang->_M_dataplus)._M_p;
  local_78.field_2._8_8_ = lang->_M_string_length;
  local_50 = 0;
  local_48 = 9;
  local_40 = "_COMPILER";
  local_38 = 0;
  views._M_len = 3;
  views._M_array = (iterator)&local_78;
  cmCatViews(&local_98,views);
  cVar6 = cmMakefile::GetDefinition(mf,&local_98);
  if (cVar6.Value == (string *)0x0) {
    if (optional) goto LAB_004e4fa0;
    local_78._M_dataplus._M_p = (pointer)local_98._M_string_length;
    local_78._M_string_length = (size_type)local_98._M_dataplus._M_p;
    local_78.field_2._M_allocated_capacity = 0;
    local_78.field_2._8_8_ = 0x1e;
    local_58 = " not set, after EnableLanguage";
    local_50 = 0;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_78;
    cmCatViews(&local_138,views_00);
    cmSystemTools::Error(&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_004e4fa0;
    uVar8 = CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,local_138.field_2._M_local_buf[0]
                    );
    _Var9._M_p = local_138._M_dataplus._M_p;
  }
  else {
    in_name = cmMakefile::GetRequiredDefinition(mf,&local_98);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_allocated_capacity =
         local_78.field_2._M_allocated_capacity & 0xffffffffffffff00;
    bVar4 = cmsys::SystemTools::FileIsFullPath(in_name);
    if (bVar4) {
      std::__cxx11::string::_M_assign((string *)&local_78);
    }
    else {
      local_f8._M_allocated_capacity = 0;
      local_f8._8_8_ = 0;
      local_e8._M_allocated_capacity = 0;
      cmsys::SystemTools::FindProgram
                (&local_138,in_name,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_f8,false);
      std::__cxx11::string::operator=((string *)&local_78,(string *)&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,
                        CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                 local_138.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_f8);
    }
    if ((optional) ||
       (((char *)local_78._M_string_length != (char *)0x0 &&
        (bVar4 = cmsys::SystemTools::FileExists(&local_78), bVar4)))) {
      cVar6 = cmState::GetInitializedCacheValue
                        ((this->CMakeInstance->State)._M_t.
                         super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                         super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                         super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_98);
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((cVar6.Value != (string *)0x0) && ((cVar6.Value)->_M_string_length != 0)) {
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        cmList::Insert(&local_b8,(const_iterator)0x0,cVar6.Value,Yes,No);
        cVar6.Value = local_b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
      }
      paVar1 = &local_138.field_2;
      local_138._M_string_length = 0;
      local_138.field_2._M_local_buf[0] = '\0';
      local_138._M_dataplus._M_p = (pointer)paVar1;
      if (cVar6.Value != (string *)0x0 && !optional) {
        local_f8._M_allocated_capacity = (size_type)&local_e8;
        local_f8._8_8_ = 0;
        local_e8._M_allocated_capacity = local_e8._M_allocated_capacity & 0xffffffffffffff00;
        bVar4 = cmsys::SystemTools::FileIsFullPath(cVar6.Value);
        if (bVar4) {
          std::__cxx11::string::_M_assign((string *)local_f8._M_local_buf);
        }
        else {
          local_118._0_8_ = (pointer)0x0;
          local_118._8_8_ = (pointer)0x0;
          local_118._16_8_ = (pointer)0x0;
          cmsys::SystemTools::FindProgram
                    ((string *)&local_d8,cVar6.Value,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_118,false);
          std::__cxx11::string::operator=
                    ((string *)local_f8._M_local_buf,(string *)local_d8._M_local_buf);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_allocated_capacity != &local_c8) {
            operator_delete((void *)local_d8._M_allocated_capacity,
                            local_c8._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_118);
        }
        local_d8._M_allocated_capacity = (size_type)&local_c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,local_78._M_dataplus._M_p,
                   (char *)(local_78._M_string_length + (long)local_78._M_dataplus._M_p));
        cmsys::SystemTools::ConvertToUnixSlashes((string *)&local_f8);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)&local_d8);
        if ((local_f8._8_8_ != local_d8._8_8_) ||
           ((local_f8._8_8_ != 0 &&
            (iVar5 = bcmp((void *)local_f8._M_allocated_capacity,
                          (void *)local_d8._M_allocated_capacity,local_f8._8_8_), iVar5 != 0)))) {
          pcVar3 = (this->CMakeInstance->State)._M_t.
                   super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                   super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          pbVar2 = (pointer)(local_118 + 0x10);
          local_118._0_8_ = pbVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_118,"__CMAKE_DELETE_CACHE_CHANGE_VARS_","");
          cVar7 = cmState::GetGlobalProperty(pcVar3,(string *)local_118);
          if ((pointer)local_118._0_8_ != pbVar2) {
            operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
          }
          if (cVar7.Value != (string *)0x0) {
            std::__cxx11::string::_M_append
                      ((char *)&local_138,(ulong)((cVar7.Value)->_M_dataplus)._M_p);
            std::__cxx11::string::append((char *)&local_138);
          }
          std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_98._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_138);
          std::__cxx11::string::_M_append
                    ((char *)&local_138,(ulong)((cVar6.Value)->_M_dataplus)._M_p);
          pcVar3 = (this->CMakeInstance->State)._M_t.
                   super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                   super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          local_118._0_8_ = pbVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_118,"__CMAKE_DELETE_CACHE_CHANGE_VARS_","");
          cmState::SetGlobalProperty(pcVar3,(string *)local_118,&local_138);
          if ((pointer)local_118._0_8_ != pbVar2) {
            operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_allocated_capacity != &local_c8) {
          operator_delete((void *)local_d8._M_allocated_capacity,local_c8._M_allocated_capacity + 1)
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_allocated_capacity != &local_e8) {
          operator_delete((void *)local_f8._M_allocated_capacity,local_e8._M_allocated_capacity + 1)
          ;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,
                        CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                 local_138.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b8);
    }
    uVar8 = local_78.field_2._M_allocated_capacity;
    _Var9._M_p = local_78._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_004e4fa0;
  }
  operator_delete(_Var9._M_p,uVar8 + 1);
LAB_004e4fa0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::ResolveLanguageCompiler(const std::string& lang,
                                                cmMakefile* mf,
                                                bool optional) const
{
  std::string langComp = cmStrCat("CMAKE_", lang, "_COMPILER");

  if (!mf->GetDefinition(langComp)) {
    if (!optional) {
      cmSystemTools::Error(
        cmStrCat(langComp, " not set, after EnableLanguage"));
    }
    return;
  }
  std::string const& name = mf->GetRequiredDefinition(langComp);
  std::string path;
  if (!cmSystemTools::FileIsFullPath(name)) {
    path = cmSystemTools::FindProgram(name);
  } else {
    path = name;
  }
  if (!optional && (path.empty() || !cmSystemTools::FileExists(path))) {
    return;
  }
  cmValue cname =
    this->GetCMakeInstance()->GetState()->GetInitializedCacheValue(langComp);

  // Split compiler from arguments
  cmList cnameArgList;
  if (cname && !cname->empty()) {
    cnameArgList.assign(*cname);
    cname = cmValue(cnameArgList.front());
  }

  std::string changeVars;
  if (cname && !optional) {
    std::string cnameString;
    if (!cmSystemTools::FileIsFullPath(*cname)) {
      cnameString = cmSystemTools::FindProgram(*cname);
    } else {
      cnameString = *cname;
    }
    std::string pathString = path;
    // get rid of potentially multiple slashes:
    cmSystemTools::ConvertToUnixSlashes(cnameString);
    cmSystemTools::ConvertToUnixSlashes(pathString);
    if (cnameString != pathString) {
      cmValue cvars = this->GetCMakeInstance()->GetState()->GetGlobalProperty(
        "__CMAKE_DELETE_CACHE_CHANGE_VARS_");
      if (cvars) {
        changeVars += *cvars;
        changeVars += ";";
      }
      changeVars += langComp;
      changeVars += ";";
      changeVars += *cname;
      this->GetCMakeInstance()->GetState()->SetGlobalProperty(
        "__CMAKE_DELETE_CACHE_CHANGE_VARS_", changeVars);
    }
  }
}